

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::SwapElements
          (ExtensionSet *this,int number,int index1,int index2)

{
  CppType CVar1;
  Extension *pEVar2;
  LogMessage LStack_28;
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x39f,"extension != nullptr");
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&LStack_28,(char (*) [38])"Index out-of-bounds (field is empty).");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&LStack_28);
  }
  if (pEVar2->is_repeated == false) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x3a0,"extension->is_repeated");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&LStack_28);
  }
  CVar1 = anon_unknown_59::cpp_type(pEVar2->type);
  switch(CVar1) {
  case CPPTYPE_INT32:
  case CPPTYPE_ENUM:
    RepeatedField<int>::SwapElements((RepeatedField<int> *)pEVar2->field_0,index1,index2);
    return;
  case CPPTYPE_INT64:
    RepeatedField<long>::SwapElements((RepeatedField<long> *)pEVar2->field_0,index1,index2);
    return;
  case CPPTYPE_UINT32:
    RepeatedField<unsigned_int>::SwapElements
              ((RepeatedField<unsigned_int> *)pEVar2->field_0,index1,index2);
    return;
  case CPPTYPE_UINT64:
    RepeatedField<unsigned_long>::SwapElements
              ((RepeatedField<unsigned_long> *)pEVar2->field_0,index1,index2);
    return;
  case CPPTYPE_DOUBLE:
    RepeatedField<double>::SwapElements((RepeatedField<double> *)pEVar2->field_0,index1,index2);
    return;
  case CPPTYPE_FLOAT:
    RepeatedField<float>::SwapElements((RepeatedField<float> *)pEVar2->field_0,index1,index2);
    return;
  case CPPTYPE_BOOL:
    RepeatedField<bool>::SwapElements((RepeatedField<bool> *)pEVar2->field_0,index1,index2);
    return;
  case CPPTYPE_STRING:
  case CPPTYPE_MESSAGE:
    RepeatedPtrFieldBase::SwapElements((RepeatedPtrFieldBase *)pEVar2->field_0,index1,index2);
    return;
  default:
    return;
  }
}

Assistant:

void ExtensionSet::SwapElements(int number, int index1, int index2) {
  Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  ABSL_DCHECK(extension->is_repeated);

  switch (cpp_type(extension->type)) {
    case WireFormatLite::CPPTYPE_INT32:
      extension->ptr.repeated_int32_t_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_INT64:
      extension->ptr.repeated_int64_t_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT32:
      extension->ptr.repeated_uint32_t_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT64:
      extension->ptr.repeated_uint64_t_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_FLOAT:
      extension->ptr.repeated_float_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_DOUBLE:
      extension->ptr.repeated_double_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_BOOL:
      extension->ptr.repeated_bool_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_ENUM:
      extension->ptr.repeated_enum_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_STRING:
      extension->ptr.repeated_string_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_MESSAGE:
      extension->ptr.repeated_message_value->SwapElements(index1, index2);
      break;
  }
}